

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O0

void __thiscall
Fad<Fad<double>>::
Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>>,FadCst<double>>>,FadCst<double>>>,FadCst<double>>>
          (Fad<Fad<double>_> *this,
          FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
          *fadexpr)

{
  int iVar1;
  FadSuper *this_00;
  FadSuper *in_RDI;
  Fad<double> *this_01;
  int in_stack_0000001c;
  Vector<Fad<double>_> *in_stack_00000020;
  int i;
  int sz;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int iVar2;
  undefined4 in_stack_ffffffffffffffa0;
  int local_28;
  
  FadSuper::FadSuper(in_RDI);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
  ::val((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
         *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  this_00 = in_RDI + 0x28;
  iVar1 = FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
          ::size((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                  *)0x1e7f92f);
  Vector<Fad<double>_>::Vector(in_stack_00000020,in_stack_0000001c);
  this_01 = (Fad<double> *)(in_RDI + 0x38);
  Fad<double>::Fad<int,_nullptr>
            ((Fad<double> *)CONCAT44(iVar1,in_stack_ffffffffffffffa0),(int *)this_00);
  iVar1 = FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
          ::size((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
                  *)0x1e7f971);
  if (iVar1 != 0) {
    iVar2 = iVar1;
    for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
      FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
      ::dx((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadCst<double>_>_>,_FadCst<double>_>_>
            *)this_00,(int)((ulong)this_01 >> 0x20));
      Vector<Fad<double>_>::operator[]((Vector<Fad<double>_> *)(in_RDI + 0x28),local_28);
      Fad<double>::operator=(this_01,(Fad<double> *)CONCAT44(iVar2,in_stack_ffffffffffffff88));
      Fad<double>::~Fad(this_01);
    }
  }
  return;
}

Assistant:

inline Fad(const FadExpr<ExprT>& fadexpr) : 
    val_(fadexpr.val()), 
    dx_(fadexpr.size()), 
    defaultVal(T(0))
    {
      int sz = fadexpr.size();

      if ( sz ) {
        for(int i=0; i<sz; ++i) 
          dx_[i] = fadexpr.dx(i);
      }
    }